

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O0

uint32_t SuperFastHash(char *data,uint32_t len,uint32_t hash)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  int rem;
  uint32_t tmp;
  uint32_t hash_local;
  uint32_t len_local;
  char *data_local;
  
  if (data == (char *)0x0) {
    data_local._4_4_ = 0;
  }
  else {
    tmp = len;
    if (len == 0) {
      sVar3 = strlen(data);
      tmp = (uint32_t)sVar3;
    }
    uVar1 = tmp & 3;
    rem = hash;
    _hash_local = (byte *)data;
    for (tmp = tmp >> 2; tmp != 0; tmp = tmp - 1) {
      uVar2 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar2 = uVar2 * 0x10000 ^
              ((uint)_hash_local[3] * 0x100 + (uint)_hash_local[2]) * 0x800 ^ uVar2;
      _hash_local = _hash_local + 4;
      rem = (uVar2 >> 0xb) + uVar2;
    }
    if (uVar1 == 1) {
      uVar1 = ((char)*_hash_local + rem) * 0x400 ^ (char)*_hash_local + rem;
      rem = (uVar1 >> 1) + uVar1;
    }
    else if (uVar1 == 2) {
      uVar1 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar1 = uVar1 * 0x800 ^ uVar1;
      rem = (uVar1 >> 0x11) + uVar1;
    }
    else if (uVar1 == 3) {
      uVar1 = (uint)_hash_local[1] * 0x100 + (uint)*_hash_local + rem;
      uVar1 = (int)(char)_hash_local[2] << 0x12 ^ uVar1 * 0x10000 ^ uVar1;
      rem = (uVar1 >> 0xb) + uVar1;
    }
    uVar1 = rem << 3 ^ rem;
    uVar1 = (uVar1 >> 5) + uVar1;
    uVar1 = uVar1 * 0x10 ^ uVar1;
    uVar1 = (uVar1 >> 0x11) + uVar1;
    uVar1 = uVar1 * 0x2000000 ^ uVar1;
    data_local._4_4_ = (uVar1 >> 6) + uVar1;
  }
  return data_local._4_4_;
}

Assistant:

inline uint32_t SuperFastHash (const char * data, uint32_t len = 0, uint32_t hash = 0) {
uint32_t tmp;
int rem;

    if (!data) return 0;
    if (!len)len = (uint32_t)::strlen(data);

    rem = len & 3;
    len >>= 2;

    /* Main loop */
    for (;len > 0; len--) {
        hash  += get16bits (data);
        tmp    = (get16bits (data+2) << 11) ^ hash;
        hash   = (hash << 16) ^ tmp;
        data  += 2*sizeof (uint16_t);
        hash  += hash >> 11;
    }

    /* Handle end cases */
    switch (rem) {
        case 3: hash += get16bits (data);
                hash ^= hash << 16;
                hash ^= data[sizeof (uint16_t)] << 18;
                hash += hash >> 11;
                break;
        case 2: hash += get16bits (data);
                hash ^= hash << 11;
                hash += hash >> 17;
                break;
        case 1: hash += *data;
                hash ^= hash << 10;
                hash += hash >> 1;
    }

    /* Force "avalanching" of final 127 bits */
    hash ^= hash << 3;
    hash += hash >> 5;
    hash ^= hash << 4;
    hash += hash >> 17;
    hash ^= hash << 25;
    hash += hash >> 6;

    return hash;
}